

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_wally_util.cpp
# Opt level: O0

string * __thiscall
cfd::core::WallyUtil::GetMnemonicWord_abi_cxx11_
          (string *__return_storage_ptr__,WallyUtil *this,words *wordlist,size_t index)

{
  CfdException *pCVar1;
  char *wally_string;
  allocator local_b9;
  string local_b8;
  CfdSourceLocation local_98;
  int local_7c;
  WallyUtil *pWStack_78;
  int ret;
  char *wally_word;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  words *local_20;
  size_t index_local;
  words *wordlist_local;
  string *word;
  
  local_20 = wordlist;
  index_local = (size_t)this;
  wordlist_local = (words *)__return_storage_ptr__;
  if ((words *)0x7ff < wordlist) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_wally_util.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0x137;
    local_38.funcname = "GetMnemonicWord";
    logger::warn<unsigned_long_const&>
              (&local_38,"GetMnemonicWord invalid index error. index=[{}]",
               (unsigned_long *)&local_20);
    wally_word._3_1_ = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_58,"GetMnemonicWord invalid index error.",&local_59);
    CfdException::CfdException(pCVar1,kCfdOutOfRangeError,&local_58);
    wally_word._3_1_ = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pWStack_78 = (WallyUtil *)0x0;
  local_7c = bip39_get_word((words *)this,(size_t)wordlist,(char **)&stack0xffffffffffffff88);
  if (local_7c == 0) {
    ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,pWStack_78,wally_string);
    return __return_storage_ptr__;
  }
  local_98.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_wally_util.cpp"
               ,0x2f);
  local_98.filename = local_98.filename + 1;
  local_98.line = 0x140;
  local_98.funcname = "GetMnemonicWord";
  logger::warn<int&>(&local_98,"Get languages error. ret=[{}]",&local_7c);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_b8,"Get languages error.",&local_b9);
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_b8);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string WallyUtil::GetMnemonicWord(
    const words* wordlist, const size_t index) {
  if (kWordlistLength <= index) {
    warn(
        CFD_LOG_SOURCE, "GetMnemonicWord invalid index error. index=[{}]",
        index);
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "GetMnemonicWord invalid index error.");
  }

  char* wally_word = NULL;
  int ret = bip39_get_word(wordlist, index, &wally_word);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "Get languages error. ret=[{}]", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Get languages error.");
  }

  std::string word = ConvertStringAndFree(wally_word);
  return word;
}